

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidgets.cpp
# Opt level: O0

void __thiscall QAccessibleTextWidget::setSelection(QAccessibleTextWidget *this)

{
  int in_stack_00000014;
  int in_stack_00000018;
  int in_stack_0000001c;
  QAccessibleTextWidget *in_stack_00000020;
  
  setSelection(in_stack_00000020,in_stack_0000001c,in_stack_00000018,in_stack_00000014);
  return;
}

Assistant:

void QAccessibleTextWidget::setSelection(int selectionIndex, int startOffset, int endOffset)
{
    if (selectionIndex != 0)
        return;

    QTextCursor cursor = textCursor();
    cursor.setPosition(startOffset, QTextCursor::MoveAnchor);
    cursor.setPosition(endOffset, QTextCursor::KeepAnchor);
    setTextCursor(cursor);
}